

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff.c
# Opt level: O0

void riff_free(riff *stream)

{
  void *in_RDI;
  riff_chunk *chunk;
  uint i;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar1;
  
  if (in_RDI != (void *)0x0) {
    if (*(long *)((long)in_RDI + 8) != 0) {
      for (uVar1 = 0; uVar1 < *(uint *)((long)in_RDI + 4); uVar1 = uVar1 + 1) {
        if (*(long *)(*(long *)((long)in_RDI + 8) + (ulong)uVar1 * 0x18 + 0x10) != 0) {
          riff_free((riff *)CONCAT44(uVar1,in_stack_fffffffffffffff0));
        }
      }
      free(*(void **)((long)in_RDI + 8));
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void riff_free( struct riff * stream )
{
	if ( stream )
	{
		if ( stream->chunks )
		{
			unsigned i;
			for ( i = 0; i < stream->chunk_count; ++i )
			{
				struct riff_chunk * chunk = stream->chunks + i;
                if ( chunk->nested ) riff_free( chunk->nested );
			}
			free( stream->chunks );
		}
		free( stream );
	}
}